

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

int QAnyStringView::compare(QAnyStringView lhs,QAnyStringView rhs,CaseSensitivity cs)

{
  int iVar1;
  ulong uVar2;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar3;
  ulong uVar4;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar5;
  QLatin1StringView rhs_00;
  QLatin1StringView s;
  QLatin1StringView s_00;
  QByteArrayView rhs_01;
  QLatin1StringView lhs_00;
  QByteArrayView utf8;
  QByteArrayView utf8_00;
  QByteArrayView lhs_01;
  
  aVar5 = lhs.field_0;
  aVar3 = rhs.field_0;
  s.m_size = lhs.m_size & 0x3fffffffffffffff;
  uVar4 = rhs.m_size & 0xc000000000000000;
  uVar2 = rhs.m_size & 0x3fffffffffffffff;
  if ((lhs.m_size & 0xc000000000000000) == 0x4000000000000000) {
    if (uVar4 == 0x4000000000000000) {
      rhs_00.m_data = aVar3.m_data_utf8;
      rhs_00.m_size = uVar2;
      lhs_00.m_data = aVar5.m_data_utf8;
      lhs_00.m_size = s.m_size;
      iVar1 = QtPrivate::compareStrings(lhs_00,rhs_00,cs);
      return iVar1;
    }
    s.m_data = aVar5.m_data_utf8;
    utf8.m_data = (storage_type *)aVar3.m_data;
    utf8.m_size = uVar2;
    iVar1 = QUtf8::compareUtf8(utf8,s,cs);
    iVar1 = -iVar1;
  }
  else {
    if (uVar4 != 0x4000000000000000) {
      rhs_01.m_data = (storage_type *)aVar3.m_data;
      rhs_01.m_size = uVar2;
      lhs_01.m_data = (storage_type *)aVar5.m_data;
      lhs_01.m_size = s.m_size;
      iVar1 = QUtf8::compareUtf8(lhs_01,rhs_01,cs);
      return iVar1;
    }
    s_00.m_data = aVar3.m_data_utf8;
    s_00.m_size = uVar2;
    utf8_00.m_data = (storage_type *)aVar5.m_data;
    utf8_00.m_size = s.m_size;
    iVar1 = QUtf8::compareUtf8(utf8_00,s_00,cs);
  }
  return iVar1;
}

Assistant:

int QAnyStringView::compare(QAnyStringView lhs, QAnyStringView rhs, Qt::CaseSensitivity cs) noexcept
{
    return lhs.visit([rhs, cs](auto lhs) {
        return rhs.visit([lhs, cs](auto rhs) {
            return QtPrivate::compareStrings(lhs, rhs, cs);
        });
    });
}